

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

int Ivy_ManCleanupSeq(Ivy_Man_t *p)

{
  undefined1 *puVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  void *pvVar5;
  Ivy_Obj_t *pIVar6;
  Vec_Ptr_t *p_00;
  ulong uVar7;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar8;
  
  puVar1 = &p->pConst1->field_0x8;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x10;
  for (iVar9 = 0; iVar9 < p->vPis->nSize; iVar9 = iVar9 + 1) {
    pvVar5 = Vec_PtrEntry(p->vPis,iVar9);
    *(byte *)((long)pvVar5 + 8) = *(byte *)((long)pvVar5 + 8) | 0x10;
  }
  for (iVar9 = 0; iVar9 < p->vPos->nSize; iVar9 = iVar9 + 1) {
    pIVar6 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPos,iVar9);
    Ivy_ManCleanupSeq_rec(pIVar6);
  }
  p_00 = Vec_PtrAlloc(100);
  for (iVar9 = 0; iVar9 < p->vObjs->nSize; iVar9 = iVar9 + 1) {
    pvVar5 = Vec_PtrEntry(p->vObjs,iVar9);
    if (pvVar5 != (void *)0x0) {
      if ((*(uint *)((long)pvVar5 + 8) & 0x10) == 0) {
        Vec_PtrPush(p_00,pvVar5);
      }
      else {
        *(uint *)((long)pvVar5 + 8) = *(uint *)((long)pvVar5 + 8) & 0xffffffef;
      }
    }
  }
  iVar9 = p_00->nSize;
  if (iVar9 != 0) {
    iVar10 = 0;
    iVar11 = 0;
    if (0 < iVar9) {
      iVar10 = iVar9;
      iVar11 = 0;
    }
    for (; iVar10 != iVar11; iVar11 = iVar11 + 1) {
      pIVar6 = (Ivy_Obj_t *)Vec_PtrEntry(p_00,iVar11);
      Ivy_ObjDisconnect(p,pIVar6);
    }
    for (iVar11 = 0; iVar11 != iVar10; iVar11 = iVar11 + 1) {
      pIVar6 = (Ivy_Obj_t *)Vec_PtrEntry(p_00,iVar11);
      if ((*(uint *)&pIVar6->field_0x8 & 0xc) != 4) {
        __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsLatch(pObj) || Ivy_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyMan.c"
                      ,0x158,"int Ivy_ManCleanupSeq(Ivy_Man_t *)");
      }
      if (pIVar6->nRefs != 0) {
        __assert_fail("Ivy_ObjRefs(pObj) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyMan.c"
                      ,0x159,"int Ivy_ManCleanupSeq(Ivy_Man_t *)");
      }
      p->nObjs[*(uint *)&pIVar6->field_0x8 & 0xf] = p->nObjs[*(uint *)&pIVar6->field_0x8 & 0xf] + -1
      ;
      p->nDeleted = p->nDeleted + 1;
      if ((p->fFanout != 0) && ((*(uint *)&pIVar6->field_0x8 & 0xf) == 7)) {
        pVVar3 = p->vBufs;
        uVar2 = pVVar3->nSize;
        uVar7 = (ulong)uVar2;
        do {
          if ((int)uVar7 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
          }
          uVar8 = uVar7 - 1;
          lVar4 = uVar7 - 1;
          uVar7 = uVar8;
        } while ((Ivy_Obj_t *)pVVar3->pArray[lVar4] != pIVar6);
        while (uVar7 = uVar8 + 1, (int)uVar7 < (int)uVar2) {
          pVVar3->pArray[uVar8] = pVVar3->pArray[uVar7];
          uVar8 = uVar7;
        }
        pVVar3->nSize = uVar2 - 1;
      }
      Vec_PtrWriteEntry(p->vObjs,pIVar6->Id,(void *)0x0);
      pIVar6->field_0x8 = pIVar6->field_0x8 & 0xf0;
      *(Ivy_Obj_t **)pIVar6 = p->pListFree;
      p->pListFree = pIVar6;
    }
  }
  Vec_PtrFree(p_00);
  return iVar9;
}

Assistant:

int Ivy_ManCleanupSeq( Ivy_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Ivy_Obj_t * pObj;
    int i, RetValue;
    // mark the constant and PIs
    Ivy_ObjSetMarkA( Ivy_ManConst1(p) );
    Ivy_ManForEachPi( p, pObj, i )
        Ivy_ObjSetMarkA( pObj );
    // mark nodes visited from POs
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManCleanupSeq_rec( pObj );
    // collect unmarked nodes
    vNodes = Vec_PtrAlloc( 100 );
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( Ivy_ObjIsMarkA(pObj) )
            Ivy_ObjClearMarkA(pObj);
        else
            Vec_PtrPush( vNodes, pObj );
    }
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrFree( vNodes );
//printf( "Sequential sweep cleaned out %d nodes.\n", 0 );
        return 0;
    }
    // disconnect the marked objects
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, i )
        Ivy_ObjDisconnect( p, pObj );
    // remove the dangling objects
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, i )
    {
        assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsLatch(pObj) || Ivy_ObjIsBuf(pObj) );
        assert( Ivy_ObjRefs(pObj) == 0 );
        // update node counters of the manager
        p->nObjs[pObj->Type]--;
        p->nDeleted++;
        // delete buffer from the array of buffers
        if ( p->fFanout && Ivy_ObjIsBuf(pObj) )
            Vec_PtrRemove( p->vBufs, pObj );
        // free the node
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
    }
    // return the number of nodes freed
    RetValue = Vec_PtrSize(vNodes);
    Vec_PtrFree( vNodes );
//printf( "Sequential sweep cleaned out %d nodes.\n", RetValue );
    return RetValue;
}